

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O3

void __thiscall
duckdb::WriteAheadLogSerializer::WriteAheadLogSerializer
          (WriteAheadLogSerializer *this,WriteAheadLog *wal,WALType wal_type)

{
  BinarySerializer *this_00;
  Allocator *allocator_p;
  SerializationOptions SStack_68;
  
  (this->checksum_writer).super_WriteStream._vptr_WriteStream =
       (_func_int **)&PTR_WriteData_0197a020;
  (this->checksum_writer).wal = wal;
  (this->checksum_writer).stream.ptr = (WriteStream *)0x0;
  allocator_p = Allocator::Get(wal->database);
  MemoryStream::MemoryStream(&(this->checksum_writer).memory_stream,allocator_p,0x200);
  (this->options).serialize_enum_as_string = false;
  (this->options).serialize_default_values = false;
  SerializationCompatibility::Default();
  SerializationOptions::SerializationOptions(&SStack_68,wal->database);
  this_00 = &this->serializer;
  BinarySerializer::BinarySerializer(this_00,(WriteStream *)this,&SStack_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)SStack_68.serialization_compatibility.duckdb_version._M_dataplus._M_p !=
      &SStack_68.serialization_compatibility.duckdb_version.field_2) {
    operator_delete(SStack_68.serialization_compatibility.duckdb_version._M_dataplus._M_p);
  }
  if ((wal->init_state)._M_i != INITIALIZED) {
    WriteAheadLog::Initialize(wal);
  }
  WriteAheadLog::WriteVersion(wal);
  BinarySerializer::OnObjectBegin(this_00);
  (*(this_00->super_Serializer)._vptr_Serializer[2])(this_00,100,"wal_type");
  Serializer::WriteValue<duckdb::WALType>(&this_00->super_Serializer,wal_type);
  (*(this_00->super_Serializer)._vptr_Serializer[3])(this_00);
  return;
}

Assistant:

WriteAheadLogSerializer(WriteAheadLog &wal, WALType wal_type)
	    : checksum_writer(wal), serializer(checksum_writer, SerializationOptions(wal.GetDatabase())) {
		if (!wal.Initialized()) {
			wal.Initialize();
		}
		// write a version marker if none has been written yet
		wal.WriteVersion();
		serializer.Begin();
		serializer.WriteProperty(100, "wal_type", wal_type);
	}